

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O1

bool QSslSocket::setActiveBackend(QString *backendName)

{
  long lVar1;
  int *piVar2;
  QMutex QVar3;
  QTlsBackend *pQVar4;
  QDebug QVar5;
  undefined1 uVar6;
  char cVar7;
  QLoggingCategory *pQVar8;
  char16_t *pcVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QStringView QVar16;
  QArrayDataPointer<QString> local_78;
  char *local_60;
  QDebug local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((backendName->d).size == 0) {
    pQVar8 = QtPrivateLogging::lcSsl();
    if (((pQVar8->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      setActiveBackend((QSslSocket *)pQVar8);
    }
    uVar6 = 0;
  }
  else {
    if ((QBasicAtomicPointer<QMutexPrivate>)
        QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
        (__base_type)0x0) {
      LOCK();
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal();
    }
    pQVar4 = QSslSocketPrivate::tlsBackend;
    if (QSslSocketPrivate::tlsBackend == (QTlsBackend *)0x0) {
      QTlsBackend::availableBackendNames();
      QVar10.m_data = (backendName->d).ptr;
      QVar10.m_size = (backendName->d).size;
      cVar7 = QtPrivate::QStringList_contains((QList *)&local_78,QVar10,CaseSensitive);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
      if (cVar7 == '\0') {
        pQVar8 = QtPrivateLogging::lcSsl();
        if (((pQVar8->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_60 = pQVar8->name;
          local_78.d._0_4_ = 2;
          local_78.d._4_4_ = 0;
          local_78.ptr._0_4_ = 0;
          local_78.ptr._4_4_ = 0;
          local_78.size._0_4_ = 0;
          local_78.size._4_4_ = 0;
          QMessageLogger::warning();
          QVar5.stream = local_58.stream;
          QVar14.m_data = (storage_type *)0x24;
          QVar14.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar14);
          QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_50);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_58.stream,' ');
          }
          pcVar9 = (backendName->d).ptr;
          if (pcVar9 == (char16_t *)0x0) {
            pcVar9 = (char16_t *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_58,(ulong)pcVar9);
          if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_58.stream,' ');
          }
          QVar5.stream = local_58.stream;
          QVar15.m_data = (storage_type *)0x9;
          QVar15.m_size = (qsizetype)local_50;
          QString::fromUtf8(QVar15);
          QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_50);
          if (local_50[0] != (QArrayData *)0x0) {
            LOCK();
            (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_50[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_58.stream,' ');
          }
          QDebug::~QDebug(&local_58);
        }
        uVar6 = 0;
      }
      else {
        QString::operator=(&QSslSocketPrivate::activeBackendName,(QString *)backendName);
        uVar6 = 1;
      }
    }
    else {
      pQVar8 = QtPrivateLogging::lcSsl();
      if (((pQVar8->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_60 = pQVar8->name;
        local_78.d._0_4_ = 2;
        local_78.d._4_4_ = 0;
        local_78.ptr._0_4_ = 0;
        local_78.ptr._4_4_ = 0;
        local_78.size._0_4_ = 0;
        local_78.size._4_4_ = 0;
        QMessageLogger::warning();
        QVar5.stream = local_58.stream;
        QVar12.m_data = (storage_type *)0x18;
        QVar12.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar12);
        QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        pcVar9 = (backendName->d).ptr;
        if (pcVar9 == (char16_t *)0x0) {
          pcVar9 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)&local_58,(ulong)pcVar9);
        if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        QVar5.stream = local_58.stream;
        QVar13.m_data = (storage_type *)0x2c;
        QVar13.m_size = (qsizetype)local_50;
        QString::fromUtf8(QVar13);
        QTextStream::operator<<((QTextStream *)QVar5.stream,(QString *)local_50);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_58.stream,' ');
        }
        QDebug::~QDebug(&local_58);
      }
      QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      LOCK();
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x0;
      UNLOCK();
      if ((QBasicAtomicPointer<QMutexPrivate>)QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p !=
          (__base_type)0x1) {
        QBasicMutex::unlockInternalFutex(&QSslSocketPrivate::backendMutex);
      }
      activeBackend();
      lVar1 = (backendName->d).size;
      if (CONCAT44(local_78.size._4_4_,(undefined4)local_78.size) == lVar1) {
        QVar11.m_data._4_4_ = local_78.ptr._4_4_;
        QVar11.m_data._0_4_ = local_78.ptr._0_4_;
        QVar11.m_size = CONCAT44(local_78.size._4_4_,(undefined4)local_78.size);
        QVar16.m_data = (backendName->d).ptr;
        QVar16.m_size = lVar1;
        uVar6 = QtPrivate::equalStrings(QVar11,QVar16);
      }
      else {
        uVar6 = 0;
      }
      piVar2 = (int *)CONCAT44(local_78.d._4_4_,local_78.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_78.d._4_4_,local_78.d._0_4_),2,0x10);
        }
      }
    }
    QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
         QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    if (pQVar4 == (QTlsBackend *)0x0) {
      LOCK();
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x0;
      UNLOCK();
      if ((QBasicAtomicPointer<QMutexPrivate>)QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p !=
          (__base_type)0x1) {
        QBasicMutex::unlockInternalFutex(&QSslSocketPrivate::backendMutex);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)uVar6;
}

Assistant:

bool QSslSocket::setActiveBackend(const QString &backendName)
{
    if (!backendName.size()) {
        qCWarning(lcSsl, "Invalid parameter (backend name cannot be an empty string)");
        return false;
    }

    QMutexLocker locker(&QSslSocketPrivate::backendMutex);
    if (QSslSocketPrivate::tlsBackend) {
        qCWarning(lcSsl) << "Cannot set backend named" << backendName
                         << "as active, another backend is already in use";
        locker.unlock();
        return activeBackend() == backendName;
    }

    if (!QTlsBackend::availableBackendNames().contains(backendName)) {
        qCWarning(lcSsl) << "Cannot set unavailable backend named" << backendName
                         << "as active";
        return false;
    }

    QSslSocketPrivate::activeBackendName = backendName;

    return true;
}